

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O1

Var __thiscall Js::SourceTextModuleRecord::ModuleEvaluation(SourceTextModuleRecord *this)

{
  Type *pTVar1;
  Var aValue;
  SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *pSVar3;
  List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar4;
  WriteBarrierPtr<Js::SourceTextModuleRecord> *pWVar5;
  code *pcVar6;
  SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *pSVar7;
  SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *pSVar8;
  bool bVar9;
  int iVar10;
  JavascriptString *pJVar11;
  undefined4 extraout_var;
  undefined4 *puVar13;
  Type *ppIVar14;
  long lVar15;
  long lVar16;
  RecyclableObject *pRVar17;
  char16_t *local_50;
  Iterator local_48;
  SourceTextModuleRecord *local_38;
  SourceTextModuleRecord *childModuleRecord;
  char16_t *pcVar12;
  
  aValue = (this->normalizedSpecifier).ptr;
  if (aValue == (Var)0x0) {
    pcVar12 = L"module";
  }
  else {
    pJVar11 = VarTo<Js::JavascriptString>(aValue);
    iVar10 = (*(pJVar11->super_RecyclableObject).super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar11);
    pcVar12 = (char16_t *)CONCAT44(extraout_var,iVar10);
  }
  pRVar17 = (RecyclableObject *)0x0;
  Output::TraceWithFlush(ModulePhase,L"ModuleEvaluation(%s)\n",pcVar12);
  if ((this->super_ModuleRecordBase).wasEvaluated == false) {
    if ((this->evaluating == false) &&
       (((((this->scriptContext).ptr)->config).threadConfig)->m_ES6Module == true)) {
      if ((this->wasPrepassed != false) || (bVar9 = ModuleEvaluationPrepass(this), bVar9)) {
        if ((this->errorObject).ptr != (void *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                      ,0x431,"(this->errorObject == nullptr)",
                                      "this->errorObject == nullptr");
          if (!bVar9) {
LAB_00b15968:
            pcVar6 = (code *)invalidInstructionException();
            (*pcVar6)();
          }
          *puVar13 = 0;
        }
        this->evaluating = true;
        pSVar2 = (this->requestedModuleList).ptr;
        pSVar8 = (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current;
        if (pSVar2 != (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          pSVar8 = pSVar2;
          pSVar7 = (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)
                   (pSVar2->super_SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>).
                   super_SListNodeBase<Memory::ArenaAllocator>.next;
          while (pSVar7 != pSVar2) {
            pSVar3 = (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)
                     (pSVar7->super_SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>).
                     super_SListNodeBase<Memory::ArenaAllocator>.next;
            (pSVar7->super_SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>).
            super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar8;
            pSVar8 = pSVar7;
            pSVar7 = pSVar3;
          }
          (pSVar7->super_SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>).
          super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar8;
          local_48.list =
               &((this->requestedModuleList).ptr)->
                super_SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>;
          local_48.current = &(local_48.list)->super_SListNodeBase<Memory::ArenaAllocator>;
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          do {
            if ((SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current ==
                (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar13 = 1;
              bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                          ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar9) goto LAB_00b15968;
              *puVar13 = 0;
            }
            local_48.current =
                 (((SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount> *)
                  &(local_48.current)->next)->super_SListNodeBase<Memory::ArenaAllocator>).next;
            pSVar8 = (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
            if ((SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current ==
                local_48.list) break;
            ppIVar14 = SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                                 (&local_48);
            local_38 = (SourceTextModuleRecord *)0x0;
            local_50 = (char16_t *)&(*ppIVar14)->field_0x22;
            bVar9 = JsUtil::
                    BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    ::TryGetValue<char16_t_const*>
                              ((BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                *)(this->childrenModuleSet).ptr,&local_50,&local_38);
            if (!bVar9) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar13 = 1;
              bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                          ,0x439,
                                          "(childrenModuleSet->TryGetValue(specifier->Psz(), &childModuleRecord))"
                                          ,
                                          "childrenModuleSet->TryGetValue(specifier->Psz(), &childModuleRecord)"
                                         );
              if (!bVar9) goto LAB_00b15968;
              *puVar13 = 0;
            }
            (*(local_38->super_ModuleRecordBase).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xc])();
            if ((local_38->errorObject).ptr != (void *)0x0) {
              ReleaseParserResourcesForHierarchy(this);
              JavascriptExceptionOperators::Throw
                        ((local_38->errorObject).ptr,(this->scriptContext).ptr);
            }
          } while( true );
        }
        local_48.current = (NodeBase *)pSVar8;
        if (this->awaitedModules == 0) {
          FinishModuleEvaluation(this,true);
        }
        else {
          pLVar4 = (this->parentModuleList).ptr;
          if ((pLVar4 != (List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)0x0) &&
             (lVar15 = (long)(pLVar4->
                             super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>
                             ).count, 0 < lVar15)) {
            pWVar5 = (pLVar4->
                     super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>
                     ).buffer.ptr;
            lVar16 = 0;
            do {
              pTVar1 = &(pWVar5[lVar16].ptr)->awaitedModules;
              *pTVar1 = *pTVar1 + 1;
              lVar16 = lVar16 + 1;
            } while (lVar15 != lVar16);
          }
        }
      }
      pRVar17 = (((((this->scriptContext).ptr)->super_ScriptContextBase).javascriptLibrary)->
                super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    else {
      pRVar17 = (RecyclableObject *)0x0;
    }
  }
  return pRVar17;
}

Assistant:

Var SourceTextModuleRecord::ModuleEvaluation()
    {
        OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("ModuleEvaluation(%s)\n"), this->GetSpecifierSz());

        if (WasEvaluated() || IsEvaluating() || !scriptContext->GetConfig()->IsES6ModuleEnabled())
        {
            return nullptr;
        }

        try
        {
            if (!WasEvaluationPrepassed())
            {
                if (!ModuleEvaluationPrepass())
                {
                    return scriptContext->GetLibrary()->GetUndefined();
                }
            }

            Assert(this->errorObject == nullptr);
            SetEvaluating(true);
            
            if (requestedModuleList != nullptr)
            {
                requestedModuleList->Reverse();
                requestedModuleList->Map([&](IdentPtr specifier) {
                    SourceTextModuleRecord* childModuleRecord = nullptr;
                    AssertOrFailFast(childrenModuleSet->TryGetValue(specifier->Psz(), &childModuleRecord));

                    childModuleRecord->ModuleEvaluation();
                    // if child module was evaluated before and threw need to re-throw now
                    // if child module has been dynamically imported and has exception need to throw
                    if (childModuleRecord->GetErrorObject() != nullptr)
                    {
                        this->ReleaseParserResourcesForHierarchy();

                        JavascriptExceptionOperators::Throw(childModuleRecord->GetErrorObject(), this->scriptContext);
                    }
                });
            }
            if (awaitedModules == 0)
            {
                FinishModuleEvaluation(true);
            }
            else
            {
                if (this->parentModuleList != nullptr)
                {
                    parentModuleList->Map([=](uint i, SourceTextModuleRecord* parentModule)
                    {
                        parentModule->IncrementAwaited();
                    });
                }
            }
        }
        catch (const Js::JavascriptException &err)
        {
            if (!WasEvaluated())
            {
                SetWasEvaluated();
            }
            SetEvaluating(false);
            JavascriptExceptionObject *exception = err.GetAndClear();
            Var errorObject = exception->GetThrownObject(scriptContext);
            AssertOrFailFastMsg(errorObject != nullptr, "ModuleEvaluation: null error object thrown from root function");
            this->errorObject = errorObject;
            if (this->promise != nullptr)
            {
                ResolveOrRejectDynamicImportPromise(false, errorObject, scriptContext, this, false);
            }
            if (isRootModule && !ReportModuleCompletion(this, errorObject))
            {
                JavascriptExceptionOperators::DoThrowCheckClone(exception, scriptContext);
            }
        }

        return scriptContext->GetLibrary()->GetUndefined();
    }